

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O2

int run_test_process_title_threadsafe(void)

{
  int iVar1;
  uv_thread_t uVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  int64_t eval_b_2;
  int64_t eval_b_3;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  uv_sem_t getter_sem;
  
  iVar1 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  uVar2 = (uv_thread_t)iVar1;
  getter_sem.__align = 0;
  setter_threads[0] = uVar2;
  if (uVar2 == 0) {
    iVar1 = uv_sem_init(&getter_sem,0);
    uVar2 = (uv_thread_t)iVar1;
    getter_thread = 0;
    setter_threads[0] = uVar2;
    if (uVar2 == 0) {
      iVar1 = uv_thread_create(&getter_thread,getter_thread_body,&getter_sem);
      uVar2 = (uv_thread_t)iVar1;
      setter_threads[0] = uVar2;
      if (uVar2 == 0) {
        for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
          iVar1 = uv_thread_create((long)setter_threads + lVar4,setter_thread_body,0);
          uVar2 = (uv_thread_t)iVar1;
          if (uVar2 != 0) {
            pcVar3 = "uv_thread_create(&setter_threads[i], setter_thread_body, ((void*)0))";
            uVar5 = 0x62;
            goto LAB_0016960d;
          }
        }
        for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
          iVar1 = uv_thread_join((long)setter_threads + lVar4);
          uVar2 = (uv_thread_t)iVar1;
          if (uVar2 != 0) {
            pcVar3 = "uv_thread_join(&setter_threads[i])";
            uVar5 = 0x65;
            goto LAB_0016960d;
          }
        }
        uv_sem_post(&getter_sem);
        iVar1 = uv_thread_join(&getter_thread);
        uVar2 = (uv_thread_t)iVar1;
        if (uVar2 == 0) {
          uv_sem_destroy(&getter_sem);
          return 0;
        }
        pcVar3 = "uv_thread_join(&getter_thread)";
        uVar5 = 0x68;
      }
      else {
        pcVar3 = "uv_thread_create(&getter_thread, getter_thread_body, &getter_sem)";
        uVar5 = 0x5f;
      }
    }
    else {
      pcVar3 = "uv_sem_init(&getter_sem, 0)";
      uVar5 = 0x5e;
    }
  }
  else {
    pcVar3 = "uv_set_process_title(titles[0])";
    uVar5 = 0x5c;
  }
LAB_0016960d:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
          ,uVar5,pcVar3,"==","0",uVar2,"==",0);
  abort();
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  uv_sem_t getter_sem;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT_OK(uv_set_process_title(titles[0]));

  ASSERT_OK(uv_sem_init(&getter_sem, 0));
  ASSERT_OK(uv_thread_create(&getter_thread, getter_thread_body, &getter_sem));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_join(&setter_threads[i]));

  uv_sem_post(&getter_sem);
  ASSERT_OK(uv_thread_join(&getter_thread));
  uv_sem_destroy(&getter_sem);

  return 0;
}